

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::IntegerStateQueryVerifiers::GetFloatVerifier::verifyInteger4Mask
          (GetFloatVerifier *this,TestContext *testCtx,GLenum name,GLint reference0,bool enableRef0,
          GLint reference1,bool enableRef1,GLint reference2,bool enableRef2,GLint reference3,
          bool enableRef3)

{
  ostringstream *this_00;
  bool bVar1;
  bool *pbVar2;
  bool *pbVar3;
  bool *pbVar4;
  StateQueryMemoryWriteGuard<float[4]> local_1e8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_1e8.m_postguard[0] = -8.0297587e+18;
  local_1e8.m_postguard[1] = -8.0297587e+18;
  local_1e8.m_postguard[2] = -8.0297587e+18;
  local_1e8.m_postguard[3] = -8.0297587e+18;
  local_1e8.m_value[0] = -8.0297587e+18;
  local_1e8.m_value[1] = -8.0297587e+18;
  local_1e8.m_value[2] = -8.0297587e+18;
  local_1e8.m_value[3] = -8.0297587e+18;
  local_1e8.m_preguard[0] = -8.0297587e+18;
  local_1e8.m_preguard[1] = -8.0297587e+18;
  local_1e8.m_preguard[2] = -8.0297587e+18;
  local_1e8.m_preguard[3] = -8.0297587e+18;
  glu::CallLogWrapper::glGetFloatv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,local_1e8.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[4]>::verifyValidity
                    (&local_1e8,testCtx);
  if (!bVar1) {
    return;
  }
  if (enableRef0) {
    if ((local_1e8.m_value[0] != (float)reference0) ||
       (NAN(local_1e8.m_value[0]) || NAN((float)reference0))) goto LAB_00faee0b;
  }
  if (enableRef1) {
    if ((local_1e8.m_value[1] != (float)reference1) ||
       (NAN(local_1e8.m_value[1]) || NAN((float)reference1))) goto LAB_00faee0b;
  }
  if (enableRef2) {
    if ((local_1e8.m_value[2] != (float)reference2) ||
       (NAN(local_1e8.m_value[2]) || NAN((float)reference2))) goto LAB_00faee0b;
  }
  if (!enableRef3) {
    return;
  }
  if ((local_1e8.m_value[3] == (float)reference3) &&
     (!NAN(local_1e8.m_value[3]) && !NAN((float)reference3))) {
    return;
  }
LAB_00faee0b:
  local_1b0._0_8_ = testCtx->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"// ERROR: expected ",0x13);
  pbVar4 = (bool *)0x1b986ab;
  pbVar2 = (bool *)0x1b986ab;
  if (enableRef0) {
    pbVar2 = glcts::fixed_sample_locations_values + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pbVar2,(ulong)!enableRef0);
  std::ostream::_M_insert<double>((double)reference0);
  pbVar3 = (bool *)0x1b21de7;
  pbVar2 = (bool *)0x1b21de7;
  if (enableRef0) {
    pbVar2 = glcts::fixed_sample_locations_values + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pbVar2,(ulong)!enableRef0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  pbVar2 = (bool *)0x1b986ab;
  if (enableRef1) {
    pbVar2 = glcts::fixed_sample_locations_values + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pbVar2,(ulong)!enableRef1);
  std::ostream::_M_insert<double>((double)reference1);
  pbVar2 = (bool *)0x1b21de7;
  if (enableRef1) {
    pbVar2 = glcts::fixed_sample_locations_values + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pbVar2,(ulong)!enableRef1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  pbVar2 = (bool *)0x1b986ab;
  if (enableRef2) {
    pbVar2 = glcts::fixed_sample_locations_values + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pbVar2,(ulong)!enableRef2);
  std::ostream::_M_insert<double>((double)reference2);
  pbVar2 = (bool *)0x1b21de7;
  if (enableRef2) {
    pbVar2 = glcts::fixed_sample_locations_values + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pbVar2,(ulong)!enableRef2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
  if (enableRef3) {
    pbVar4 = glcts::fixed_sample_locations_values + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pbVar4,(ulong)!enableRef3);
  std::ostream::_M_insert<double>((double)reference3);
  if (enableRef3) {
    pbVar3 = glcts::fixed_sample_locations_values + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pbVar3,(ulong)!enableRef3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
    tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid float value");
  }
  return;
}

Assistant:

void GetFloatVerifier::verifyInteger4Mask (tcu::TestContext& testCtx, GLenum name, GLint reference0, bool enableRef0, GLint reference1, bool enableRef1, GLint reference2, bool enableRef2, GLint reference3, bool enableRef3)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLfloat[4]> floatVector4;
	glGetFloatv(name, floatVector4);

	if (!floatVector4.verifyValidity(testCtx))
		return;

	if ((enableRef0 && (floatVector4[0] != GLfloat(reference0))) ||
		(enableRef1 && (floatVector4[1] != GLfloat(reference1))) ||
		(enableRef2 && (floatVector4[2] != GLfloat(reference2))) ||
		(enableRef3 && (floatVector4[3] != GLfloat(reference3))))
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected "
			<< (enableRef0?"":"(") << GLfloat(reference0) << (enableRef0?"":")") << ", "
			<< (enableRef1?"":"(") << GLfloat(reference1) << (enableRef1?"":")") << ", "
			<< (enableRef2?"":"(") << GLfloat(reference2) << (enableRef2?"":")") << ", "
			<< (enableRef3?"":"(") << GLfloat(reference3) << (enableRef3?"":")") << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid float value");
	}
}